

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreevent.h
# Opt level: O2

void __thiscall PressDelayHandler::timerEvent(PressDelayHandler *this,QTimerEvent *e)

{
  bool bVar1;
  
  if (*(TimerId *)(e + 0x10) == (this->pressDelayTimer).m_id) {
    if ((this->pressDelayEvent).d != (QMouseEvent *)0x0) {
      bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this->mouseTarget);
      if (bVar1) {
        sendMouseEvent(this,(this->pressDelayEvent).d,1);
      }
    }
    QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_>::reset
              (&this->pressDelayEvent,(QMouseEvent *)0x0);
    if ((this->pressDelayTimer).m_id != Invalid) {
      QBasicTimer::stop();
      return;
    }
  }
  return;
}

Assistant:

Qt::TimerId id() const { return m_id; }